

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Writer::PerformPuts(BP3Writer *this)

{
  _Rb_tree_node_base *name;
  _func_int *p_Var1;
  size_t dataIn;
  BP3Serializer *pBVar2;
  DataType DVar3;
  int iVar4;
  Variable<signed_char> *variable;
  Variable<char> *variable_00;
  Variable<long_double> *variable_01;
  Variable<unsigned_char> *variable_02;
  Variable<std::complex<double>_> *variable_03;
  Variable<unsigned_short> *variable_04;
  Variable<std::complex<float>_> *variable_05;
  Variable<long> *variable_06;
  Variable<int> *variable_07;
  Variable<short> *variable_08;
  Variable<unsigned_int> *variable_09;
  Variable<unsigned_long> *variable_10;
  Variable<double> *variable_11;
  Variable<float> *variable_12;
  _Rb_tree_node_base *p_Var5;
  ScopedTimer __var261;
  allocator local_229;
  ScopedTimer local_228;
  BP3Serializer *local_220;
  _Rb_tree_node_base *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((PerformPuts()::__var61 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&PerformPuts()::__var61), iVar4 != 0)) {
    PerformPuts::__var61 = (void *)ps_timer_create_("BP3Writer::PerformPuts");
    __cxa_guard_release(&PerformPuts()::__var61);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_228,PerformPuts::__var61);
  p_Var1 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  if (*(long *)(p_Var1 + 0x390 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) != 0) {
    dataIn = *(size_t *)
              (p_Var1 + 0x398 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base);
    std::__cxx11::string::string((string *)&local_210,"in call to PerformPuts",&local_229);
    adios2::format::BPBase::ResizeBuffer
              ((BPBase *)(p_Var1 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),
               dataIn,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    p_Var1 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
    local_218 = (_Rb_tree_node_base *)
                (&(this->m_BP3Serializer).super_BP3Base.field_0x370 + (long)p_Var1);
    local_220 = &this->m_BP3Serializer;
    for (p_Var5 = *(_Rb_tree_node_base **)
                   (p_Var1 + 0x380 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base);
        pBVar2 = local_220, p_Var5 != local_218;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      name = p_Var5 + 1;
      DVar3 = IO::InquireVariableType((this->super_Engine).m_IO,(string *)name);
      switch(DVar3) {
      case Int8:
        std::__cxx11::string::string
                  ((string *)&local_70,"in call to PerformPuts, EndStep or Close",&local_229);
        variable = Engine::FindVariable<signed_char>(&this->super_Engine,(string *)name,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        PerformPutCommon<signed_char>(this,variable);
        break;
      case Int16:
        std::__cxx11::string::string
                  ((string *)&local_90,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_08 = Engine::FindVariable<short>(&this->super_Engine,(string *)name,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        PerformPutCommon<short>(this,variable_08);
        break;
      case Int32:
        std::__cxx11::string::string
                  ((string *)&local_b0,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_07 = Engine::FindVariable<int>(&this->super_Engine,(string *)name,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        PerformPutCommon<int>(this,variable_07);
        break;
      case Int64:
        std::__cxx11::string::string
                  ((string *)&local_d0,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_06 = Engine::FindVariable<long>(&this->super_Engine,(string *)name,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        PerformPutCommon<long>(this,variable_06);
        break;
      case UInt8:
        std::__cxx11::string::string
                  ((string *)&local_f0,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_02 = Engine::FindVariable<unsigned_char>
                                (&this->super_Engine,(string *)name,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        PerformPutCommon<unsigned_char>(this,variable_02);
        break;
      case UInt16:
        std::__cxx11::string::string
                  ((string *)&local_110,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_04 = Engine::FindVariable<unsigned_short>
                                (&this->super_Engine,(string *)name,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        PerformPutCommon<unsigned_short>(this,variable_04);
        break;
      case UInt32:
        std::__cxx11::string::string
                  ((string *)&local_130,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_09 = Engine::FindVariable<unsigned_int>
                                (&this->super_Engine,(string *)name,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        PerformPutCommon<unsigned_int>(this,variable_09);
        break;
      case UInt64:
        std::__cxx11::string::string
                  ((string *)&local_150,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_10 = Engine::FindVariable<unsigned_long>
                                (&this->super_Engine,(string *)name,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        PerformPutCommon<unsigned_long>(this,variable_10);
        break;
      case Float:
        std::__cxx11::string::string
                  ((string *)&local_170,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_12 = Engine::FindVariable<float>(&this->super_Engine,(string *)name,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        PerformPutCommon<float>(this,variable_12);
        break;
      case Double:
        std::__cxx11::string::string
                  ((string *)&local_190,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_11 = Engine::FindVariable<double>(&this->super_Engine,(string *)name,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        PerformPutCommon<double>(this,variable_11);
        break;
      case LongDouble:
        std::__cxx11::string::string
                  ((string *)&local_1b0,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_01 = Engine::FindVariable<long_double>
                                (&this->super_Engine,(string *)name,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        PerformPutCommon<long_double>(this,variable_01);
        break;
      case FloatComplex:
        std::__cxx11::string::string
                  ((string *)&local_1d0,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_05 = Engine::FindVariable<std::complex<float>>
                                (&this->super_Engine,(string *)name,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        PerformPutCommon<std::complex<float>>(this,variable_05);
        break;
      case DoubleComplex:
        std::__cxx11::string::string
                  ((string *)&local_1f0,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_03 = Engine::FindVariable<std::complex<double>>
                                (&this->super_Engine,(string *)name,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        PerformPutCommon<std::complex<double>>(this,variable_03);
        break;
      case Char:
        std::__cxx11::string::string
                  ((string *)&local_50,"in call to PerformPuts, EndStep or Close",&local_229);
        variable_00 = Engine::FindVariable<char>(&this->super_Engine,(string *)name,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        PerformPutCommon<char>(this,variable_00);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(&(local_220->super_BP3Base).field_0x368 +
               (long)(local_220->super_BP3Base)._vptr_BP3Base[-3]));
    *(undefined8 *)
     (&(pBVar2->super_BP3Base).field_0x398 + (long)(pBVar2->super_BP3Base)._vptr_BP3Base[-3]) = 0;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_228);
  return;
}

Assistant:

void BP3Writer::PerformPuts()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::PerformPuts");
    if (m_BP3Serializer.m_DeferredVariables.empty())
    {
        return;
    }

    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_DeferredVariablesDataSize,
                                 "in call to PerformPuts");

    for (const std::string &variableName : m_BP3Serializer.m_DeferredVariables)
    {
        const DataType type = m_IO.InquireVariableType(variableName);
        if (type == DataType::Struct)
        {
            // not supported
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable =                                                                    \
            FindVariable<T>(variableName, "in call to PerformPuts, EndStep or Close");             \
        PerformPutCommon(variable);                                                                \
    }

        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
    }
    m_BP3Serializer.m_DeferredVariables.clear();
    m_BP3Serializer.m_DeferredVariablesDataSize = 0;
}